

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall
ON_Brep::SetEdgeCurve(ON_Brep *this,ON_BrepEdge *edge,int c3_index,ON_Interval *sub_domain)

{
  ON_Curve **ppOVar1;
  bool bVar2;
  ON_Interval *pOVar3;
  ON_Interval *pOVar4;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  ON_Interval real_curve_subdomain;
  ON_Interval curve_domain;
  ON_Interval local_40;
  
  if (sub_domain == (ON_Interval *)0x0 && c3_index == -1) {
    edge->m_c3i = -1;
    ON_CurveProxy::SetProxyCurve(&edge->super_ON_CurveProxy,(ON_Curve *)0x0);
  }
  else {
    if (c3_index < 0) {
      return false;
    }
    if ((this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count < c3_index) {
      return false;
    }
    ppOVar1 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a;
    if (ppOVar1[(uint)c3_index] == (ON_Curve *)0x0) {
      return false;
    }
    (*(ppOVar1[(uint)c3_index]->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    local_40.m_t[0] = extraout_XMM0_Qa;
    local_40.m_t[1] = in_XMM1_Qa;
    pOVar3 = &local_40;
    if (sub_domain != (ON_Interval *)0x0) {
      bVar2 = ON_Interval::IsIncreasing(sub_domain);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_Interval::Includes(&local_40,sub_domain,false);
      pOVar3 = sub_domain;
      if (!bVar2) {
        return false;
      }
    }
    edge->m_c3i = c3_index;
    pOVar4 = &local_40;
    if (sub_domain != (ON_Interval *)0x0) {
      pOVar4 = sub_domain;
    }
    real_curve_subdomain.m_t[1] = pOVar4->m_t[1];
    real_curve_subdomain.m_t[0] = pOVar3->m_t[0];
    ON_CurveProxy::SetProxyCurve
              (&edge->super_ON_CurveProxy,
               (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[(uint)c3_index],
               real_curve_subdomain);
  }
  return true;
}

Assistant:

bool ON_Brep::SetEdgeCurve( 
  ON_BrepEdge& edge,
  int c3_index,
  const ON_Interval* sub_domain
  )
{
  bool rc = false;
  if ( c3_index == - 1 && !sub_domain )
  {
    edge.m_c3i = -1;
    edge.SetProxyCurve(0);
    rc = true;
  }
  else if ( c3_index >= 0 && c3_index <= m_C3.Count() && m_C3[c3_index] )
  {
    ON_Interval curve_domain = m_C3[c3_index]->Domain();
    if ( !sub_domain || (sub_domain->IsIncreasing() && curve_domain.Includes(*sub_domain)) )
    {
      edge.m_c3i = c3_index;
      edge.SetProxyCurve( m_C3[c3_index], 
                          (sub_domain) ? *sub_domain : curve_domain
                          );
      rc = true;
    }
  }
  return rc;
}